

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

Node * makeAlternate(Node *e)

{
  Node *pNVar1;
  
  pNVar1 = e;
  if (e->type != 10) {
    pNVar1 = _newNode(10,0x28);
    if ((e->rule).next != (Node *)0x0) {
      __assert_fail("!e->any.next",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/3rd/greg/tree.c"
                    ,0xb5,"Node *makeAlternate(Node *)");
    }
    (pNVar1->rule).variables = e;
    (pNVar1->name).rule = e;
  }
  return pNVar1;
}

Assistant:

Node *makeAlternate(Node *e)
{
  if (Alternate != e->type)
    {
      Node *node= newNode(Alternate);
      assert(e);
      assert(!e->any.next);
      node->alternate.first=
	node->alternate.last= e;
      return node;
    }
  return e;
}